

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void resizestack(lua_State *L,MSize n)

{
  uint *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  void *p;
  
  uVar3 = (ulong)(L->glref).ptr32;
  p = (void *)(ulong)(L->stack).ptr32;
  uVar5 = L->stacksize;
  uVar7 = (ulong)uVar5;
  uVar2 = *(undefined4 *)(uVar3 + 0x160);
  *(undefined4 *)(uVar3 + 0x160) = 0xffffffff;
  uVar8 = n + 6;
  pvVar4 = lj_mem_realloc(L,p,uVar5 * 8,n * 8 + 0x30);
  (L->stack).ptr32 = (uint32_t)pvVar4;
  (L->maxstack).ptr32 = (uint32_t)pvVar4 + n * 8;
  if (uVar5 < uVar8) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pvVar4 + lVar6 * 8 + uVar7 * 8 + 4) = 0xffffffff;
      lVar6 = lVar6 + 1;
    } while ((uVar7 - uVar8) + lVar6 != 0);
    uVar7 = (ulong)(uVar5 + (int)lVar6);
  }
  lVar6 = (long)pvVar4 - (long)p;
  L->stacksize = uVar8;
  uVar3 = (ulong)(L->glref).ptr32;
  uVar5 = *(uint *)(uVar3 + 400);
  if ((ulong)uVar5 - (long)p < uVar7) {
    *(uint *)(uVar3 + 400) = uVar5 + (int)lVar6;
  }
  L->base = (TValue *)((long)L->base + lVar6);
  L->top = (TValue *)((long)L->top + lVar6);
  for (uVar5 = (L->openupval).gcptr32; uVar5 != 0; uVar5 = *(uint *)(ulong)uVar5) {
    puVar1 = (uint *)(ulong)uVar5 + 4;
    *puVar1 = *puVar1 + (int)lVar6;
  }
  *(undefined4 *)((ulong)(L->glref).ptr32 + 0x160) = uVar2;
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  int32_t oldvmstate = G(L)->vmstate;

  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");

  /*
  ** Lua stack is inconsistent while reallocation, profilers
  ** depend on vmstate during reports, so set vmstate to INTERP
  ** to avoid inconsistent behaviour.
  */
  setvmstate(G(L), INTERP);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));

  G(L)->vmstate = oldvmstate;
}